

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServerSocket.cpp
# Opt level: O0

int __thiscall
mognetwork::TcpServerSocket::accept
          (TcpServerSocket *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  SocketFD __fd_00;
  int iVar1;
  void *pvVar2;
  SocketFD cSocket;
  socklen_t sinsize;
  sockaddr_in csin;
  socklen_t local_24;
  undefined1 local_20 [12];
  SocketFD in_stack_ffffffffffffffec;
  TcpServerSocket *this_00;
  int local_8;
  
  this_00 = this;
  memset(local_20,0,0x10);
  local_24 = 0x10;
  __fd_00 = Socket::getSocketFD((Socket *)this);
  iVar1 = ::accept(__fd_00,(sockaddr *)local_20,&local_24);
  if (iVar1 == -1) {
    local_8 = 0;
  }
  else {
    pvVar2 = operator_new(0xa0);
    local_8 = (int)pvVar2;
    TcpSocket::TcpSocket(&this_00->super_TcpSocket,in_stack_ffffffffffffffec);
  }
  return local_8;
}

Assistant:

TcpSocket* TcpServerSocket::accept()
  {
    sockaddr_in csin;
    memset(&csin, 0, sizeof(csin));
    socklen_t sinsize = sizeof(csin);
    SocketFD cSocket;
    if ((cSocket = ::accept(getSocketFD(), (sockaddr*)&csin, &sinsize)) == -1)
      return NULL;
    return new TcpSocket(cSocket);
  }